

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  CppType CVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  GeneratorOptions *pGVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  AlphaNum *a;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  FieldDescriptor *extraout_RDX;
  AlphaNum *a_00;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  BytesMode in_R8D;
  BytesMode bytes_mode;
  undefined1 in_R9B;
  undefined1 drop_list;
  char **args_3;
  string in_stack_ffffffffffffff38;
  string local_98;
  char *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  strings::AlphaNum::AlphaNum((AlphaNum *)&stack0xffffffffffffff38,*(int *)(field + 4));
  psVar5 = &local_98;
  StrCat_abi_cxx11_(psVar5,(protobuf *)&stack0xffffffffffffff38,a);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,"    case $num$:\n",(char (*) [4])0x3d93fc,psVar5);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    psVar5 = (string *)&stack0xffffffffffffff38;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar5,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
               in_R8D,(bool)in_R9B);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
               ,(char (*) [5])0x3de831,psVar5);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)this_00,options_00,
               (FieldDescriptor *)psVar5);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_98,(_anonymous_namespace_ *)this_01,options_01,(FieldDescriptor *)psVar5);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff38;
    io::Printer::Print<char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,
               "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$",
               (char (*) [12])"keyReaderFn",pbVar6,(char (*) [14])"valueReaderFn",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    TVar2 = FieldDescriptor::type(this_01);
    if (TVar2 == TYPE_MESSAGE) {
      pGVar4 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)options,pGVar4,
                 (Descriptor *)pbVar6);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", $messageType$.deserializeBinaryFromReader",(char (*) [12])"messageType",
                 (string *)&stack0xffffffffffffff38);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      field_01 = extraout_RDX;
    }
    else {
      io::Printer::Print<>(printer,", null");
      field_01 = extraout_RDX_00;
    }
    psVar5 = (string *)&stack0xffffffffffffff38;
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              (psVar5,(_anonymous_namespace_ *)this_00,field_01);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,", $defaultKey$",(char (*) [11])"defaultKey",psVar5);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    TVar2 = FieldDescriptor::type(this_01);
    if (TVar2 == TYPE_MESSAGE) {
      pGVar4 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)options,pGVar4,
                 (Descriptor *)psVar5);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", new $messageType$()",(char (*) [12])"messageType",
                 (string *)&stack0xffffffffffffff38);
    }
    else {
      (anonymous_namespace)::JSFieldDefault_abi_cxx11_
                ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)this_01,field_02);
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,", $defaultValue$",(char (*) [13])"defaultValue",
                 (string *)&stack0xffffffffffffff38);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    io::Printer::Print<>(printer,");\n");
    io::Printer::Print<>(printer,"         });\n");
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_98,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)psVar5);
      TVar2 = FieldDescriptor::type(field);
      local_78 = "jspb.Message";
      if (TVar2 == TYPE_GROUP) {
        local_78 = "msgOrGroup";
      }
      local_78 = local_78 + 5;
      TVar2 = FieldDescriptor::type(field);
      if (TVar2 == TYPE_GROUP) {
        strings::AlphaNum::AlphaNum((AlphaNum *)&stack0xffffffffffffff38,*(int *)(field + 4));
        StrCat_abi_cxx11_(&local_70,(protobuf *)&stack0xffffffffffffff38,a_00);
        std::operator+(&local_50,&local_70,", ");
      }
      else {
        std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_70);
      }
      bytes_mode = 0x3d5f2f;
      args_3 = &local_78;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[11],char_const*,char[9],std::__cxx11::string>
                (printer,
                 "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
                 ,(char (*) [11])"fieldclass",&local_98,(char (*) [11])"msgOrGroup",args_3,
                 (char (*) [9])"grpfield",&local_50);
      drop_list = SUB81(args_3,0);
      std::__cxx11::string::~string((string *)&local_50);
      if (TVar2 == TYPE_GROUP) {
        std::__cxx11::string::~string((string *)&local_70);
      }
      psVar5 = &local_98;
    }
    else {
      bVar1 = FieldDescriptor::is_packable(field);
      if (bVar1) {
        (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                  ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)options,
                   (GeneratorOptions *)field,(FieldDescriptor *)0x0,true,false,true,BYTES_DEFAULT,
                   (bool)in_stack_ffffffffffffff38);
        (anonymous_namespace)::JSBinaryReaderMethodType_abi_cxx11_
                  (&local_98,(_anonymous_namespace_ *)field,field_00);
        bytes_mode = 0x403759;
        pbVar6 = &local_98;
        io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                  (printer,
                   "      var values = /** @type {$fieldtype$} */ (reader.isDelimited() ? reader.readPacked$reader$() : [reader.read$reader$()]);\n"
                   ,(char (*) [10])"fieldtype",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff38,(char (*) [7])0x403759,pbVar6);
        drop_list = SUB81(pbVar6,0);
      }
      else {
        bVar1 = false;
        (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                  ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)options,
                   (GeneratorOptions *)field,(FieldDescriptor *)0x0,true,true,true,BYTES_DEFAULT,
                   (bool)in_stack_ffffffffffffff38);
        (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
                  (&local_98,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,bVar1);
        bytes_mode = 0x403759;
        pbVar6 = &local_98;
        io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                  (printer,"      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n"
                   ,(char (*) [10])"fieldtype",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff38,(char (*) [7])0x403759,pbVar6);
        drop_list = SUB81(pbVar6,0);
      }
      std::__cxx11::string::~string((string *)&local_98);
      psVar5 = (string *)&stack0xffffffffffffff38;
    }
    std::__cxx11::string::~string((string *)psVar5);
    bVar1 = FieldDescriptor::is_packable(field);
    if (bVar1) {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)field,
                 (GeneratorOptions *)0x0,(FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,
                 "      for (var i = 0; i < values.length; i++) {\n        msg.add$name$(values[i]);\n      }\n"
                 ,(char (*) [5])0x3de831,(string *)&stack0xffffffffffffff38);
    }
    else if ((~(byte)field[1] & 0x60) == 0) {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)field,
                 (GeneratorOptions *)0x0,(FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"      msg.add$name$(value);\n",(char (*) [5])0x3de831,
                 (string *)&stack0xffffffffffffff38);
    }
    else {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)&stack0xffffffffffffff38,(_anonymous_namespace_ *)field,
                 (GeneratorOptions *)0x0,(FieldDescriptor *)0x0,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"      msg.set$name$(value);\n",(char (*) [5])0x3de831,
                 (string *)&stack0xffffffffffffff38);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  }
  io::Printer::Print<>(printer,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  printer->Print("    case $num$:\n", "num", StrCat(field->number()));

  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print(
        "        jspb.Map.deserializeBinary(message, reader, "
        "$keyReaderFn$, $valueReaderFn$",
        "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
        "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
                     "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", null");
    }
    printer->Print(", $defaultKey$", "defaultKey", JSFieldDefault(key_field));
    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", new $messageType$()", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", $defaultValue$", "defaultValue",
                     JSFieldDefault(value_field));
    }
    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
          "fieldclass", SubmessageTypeRef(options, field), "msgOrGroup",
          (field->type() == FieldDescriptor::TYPE_GROUP) ? "Group" : "Message",
          "grpfield",
          (field->type() == FieldDescriptor::TYPE_GROUP)
              ? (StrCat(field->number()) + ", ")
              : "");
    } else if (field->is_packable()) {
      printer->Print(
          "      var values = /** @type {$fieldtype$} */ "
          "(reader.isDelimited() "
          "? reader.readPacked$reader$() : [reader.read$reader$()]);\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ false, BYTES_U8),
          "reader", JSBinaryReaderMethodType(field));
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ true, BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_packable()) {
      printer->Print(
          "      for (var i = 0; i < values.length; i++) {\n"
          "        msg.add$name$(values[i]);\n"
          "      }\n",
          "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else if (field->is_repeated()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print("      msg.set$name$(value);\n", "name",
                     JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}